

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O2

void __thiscall
QParallelAnimationGroup::QParallelAnimationGroup(QParallelAnimationGroup *this,QObject *parent)

{
  QParallelAnimationGroupPrivate *this_00;
  
  this_00 = (QParallelAnimationGroupPrivate *)operator_new(200);
  QParallelAnimationGroupPrivate::QParallelAnimationGroupPrivate(this_00);
  QAnimationGroup::QAnimationGroup((QAnimationGroup *)this,(QAnimationGroupPrivate *)this_00,parent)
  ;
  *(undefined ***)this = &PTR_metaObject_006682c0;
  return;
}

Assistant:

QParallelAnimationGroup::QParallelAnimationGroup(QObject *parent)
    : QAnimationGroup(*new QParallelAnimationGroupPrivate, parent)
{
}